

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::InternalSwap(Options *this,Options *other)

{
  bool bVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  string *psVar2;
  Arena *this_01;
  string *psVar3;
  long in_RSI;
  Options *in_RDI;
  string *other_ptr_1;
  string *this_ptr_1;
  string *other_ptr;
  string *this_ptr;
  UnknownFieldSet *in_stack_fffffffffffffec8;
  ArenaStringPtr *this_02;
  Arena *in_stack_fffffffffffffed0;
  Arena *arena;
  string *in_stack_fffffffffffffed8;
  ArenaStringPtr *in_stack_fffffffffffffee0;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff00;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if ((((uint)(in_RDI->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 1) || (((uint)*(undefined8 *)this_00 & 1) == 1)) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (this_00);
    }
    else {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      ::mutable_unknown_fields_slow(in_stack_ffffffffffffff00);
    }
    google::protobuf::internal::InternalMetadataWithArena::DoSwap
              ((InternalMetadataWithArena *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  std::swap<unsigned_int>((in_RDI->_has_bits_).has_bits_,(uint *)(in_RSI + 0x10));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffed0,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffed0,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffed0,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8);
  google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::InternalSwap
            ((RepeatedPtrField<bloaty::CustomDataSource> *)in_stack_fffffffffffffed0,
             (RepeatedPtrField<bloaty::CustomDataSource> *)in_stack_fffffffffffffec8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffed0,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffed0,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(in_RDI);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault
                    (&in_RDI->disassemble_function_,psVar2);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault
                        ((ArenaStringPtr *)(in_RSI + 0xa8),psVar2), !bVar1)) {
    psVar2 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed0);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::swap((string *)psVar2);
  }
  this_02 = &in_RDI->source_filter_;
  this_01 = (Arena *)(in_RSI + 0xb0);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(in_RDI);
  arena = this_01;
  psVar2 = psVar3;
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(this_02,psVar3);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault
                        ((ArenaStringPtr *)this_01,psVar3), !bVar1)) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable(this_02,psVar2,arena);
    google::protobuf::internal::ArenaStringPtr::Mutable(this_02,psVar2,arena);
    std::__cxx11::string::swap((string *)psVar3);
  }
  std::swap<int>(&in_RDI->demangle_,(int *)(in_RSI + 0xb8));
  std::swap<int>(&in_RDI->sort_by_,(int *)(in_RSI + 0xbc));
  std::swap<int>(&in_RDI->verbose_level_,(int *)(in_RSI + 0xc0));
  std::swap<bool>(&in_RDI->dump_raw_map_,(bool *)(in_RSI + 0xc4));
  std::swap<unsigned_long>(&in_RDI->debug_vmaddr_,(unsigned_long *)(in_RSI + 200));
  std::swap<unsigned_long>(&in_RDI->debug_fileoff_,(unsigned_long *)(in_RSI + 0xd0));
  std::swap<long>(&in_RDI->max_rows_per_level_,(long *)(in_RSI + 0xd8));
  return;
}

Assistant:

void Options::InternalSwap(Options* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  filename_.InternalSwap(&other->filename_);
  base_filename_.InternalSwap(&other->base_filename_);
  data_source_.InternalSwap(&other->data_source_);
  custom_data_source_.InternalSwap(&other->custom_data_source_);
  debug_filename_.InternalSwap(&other->debug_filename_);
  source_map_.InternalSwap(&other->source_map_);
  disassemble_function_.Swap(&other->disassemble_function_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  source_filter_.Swap(&other->source_filter_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(demangle_, other->demangle_);
  swap(sort_by_, other->sort_by_);
  swap(verbose_level_, other->verbose_level_);
  swap(dump_raw_map_, other->dump_raw_map_);
  swap(debug_vmaddr_, other->debug_vmaddr_);
  swap(debug_fileoff_, other->debug_fileoff_);
  swap(max_rows_per_level_, other->max_rows_per_level_);
}